

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void constructor(LexState *ls,expdesc *t)

{
  FuncState *fs;
  uint uVar1;
  expkind eVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ConsControl cc;
  
  iVar5 = ls->linenumber;
  fs = ls->fs;
  uVar1 = luaK_codeABC(fs,OP_NEWTABLE,0,0,0);
  cc.tostore = 0;
  cc.nh = 0;
  cc.na = 0;
  t->t = -1;
  t->f = -1;
  t->k = VRELOCABLE;
  (t->u).info = uVar1;
  t->ravi_type_map = 0x80;
  t->usertype = (TString *)0x0;
  (t->u).ind.usertype = (TString *)0x0;
  t->pc = uVar1;
  cc.v.t = -1;
  cc.v.f = -1;
  cc.v.k = VVOID;
  cc.v.u.info = 0;
  cc.v.ravi_type_map = 0xffffffff;
  cc.v.usertype = (TString *)0x0;
  cc.v.pc = -1;
  cc.v.u.ind.usertype = (TString *)0x0;
  cc.t = t;
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  eVar2 = VVOID;
  iVar3 = 0;
  do {
    if ((eVar2 != VVOID) && (iVar3 < 1)) {
      __assert_fail("cc.v.k == VVOID || cc.tostore > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x4b3,"void constructor(LexState *, expdesc *)");
    }
    iVar3 = (ls->t).token;
    if (iVar3 == 0x7d) break;
    if (eVar2 != VVOID) {
      luaK_exp2nextreg(fs,&cc.v);
      cc.v.k = VVOID;
      if (cc.tostore == 0x32) {
        luaK_setlist(fs,((cc.t)->u).info,cc.na,0x32);
        cc.tostore = 0;
      }
      iVar3 = (ls->t).token;
    }
    if ((iVar3 == 0x5b) || ((iVar3 == 0x125 && (iVar3 = luaX_lookahead(ls), iVar3 == 0x3d)))) {
      recfield(ls,&cc);
    }
    else {
      listfield(ls,&cc);
    }
    iVar4 = testnext(ls,0x2c);
    eVar2 = cc.v.k;
    iVar3 = cc.tostore;
  } while ((iVar4 != 0) ||
          (iVar4 = testnext(ls,0x3b), eVar2 = cc.v.k, iVar3 = cc.tostore, iVar4 != 0));
  check_match(ls,0x7d,0x7b,iVar5);
  if (cc.tostore != 0) {
    if (cc.v.k - VCALL < 2) {
      luaK_setreturns(fs,&cc.v,-1);
      luaK_setlist(fs,((cc.t)->u).info,cc.na,-1);
      cc.na = cc.na + -1;
    }
    else {
      if (cc.v.k != VVOID) {
        luaK_exp2nextreg(fs,&cc.v);
      }
      luaK_setlist(fs,((cc.t)->u).info,cc.na,cc.tostore);
    }
  }
  iVar5 = luaO_int2fb(cc.na);
  *(char *)((long)fs->f->code + (long)(int)uVar1 * 4 + 3) = (char)iVar5;
  iVar5 = luaO_int2fb(cc.nh);
  *(char *)((long)fs->f->code + (long)(int)uVar1 * 4 + 2) = (char)iVar5;
  if (((byte)ravi_parser_debug & 1) != 0) {
    raviY_printf(ls->fs,"constructor (OP_NEWTABLE pc = %d) %e\n",(ulong)uVar1,t);
  }
  return;
}

Assistant:

static void constructor (LexState *ls, expdesc *t) {
  /* constructor -> '{' [ field { sep field } [sep] ] '}'
     sep -> ',' | ';' */
  FuncState *fs = ls->fs;
  int line = ls->linenumber;
  int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
  struct ConsControl cc;
  cc.na = cc.nh = cc.tostore = 0;
  cc.t = t;
  init_exp(t, VRELOCABLE, pc, RAVI_TM_TABLE, NULL); /* RAVI initial type may be modified */
  t->pc = pc; /* RAVI save pc of OP_NEWTABLE instruction so that the correct type can be set later */
  init_exp(&cc.v, VVOID, 0, RAVI_TM_ANY, NULL);  /* no value (yet) */
  luaK_exp2nextreg(ls->fs, t);  /* fix it at stack top */
  checknext(ls, '{');
  do {
    lua_assert(cc.v.k == VVOID || cc.tostore > 0);
    if (ls->t.token == '}') break;
    closelistfield(fs, &cc);
    field(ls, &cc);
  } while (testnext(ls, ',') || testnext(ls, ';'));
  check_match(ls, '}', '{', line);
  lastlistfield(fs, &cc);
  SETARG_B(fs->f->code[pc], luaO_int2fb(cc.na)); /* set initial array size */
  SETARG_C(fs->f->code[pc], luaO_int2fb(cc.nh));  /* set initial table size */
  DEBUG_EXPR(raviY_printf(ls->fs, "constructor (OP_NEWTABLE pc = %d) %e\n", pc, t);)
}